

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O0

void __thiscall QSystemTrayIconSys::resizeEvent(QSystemTrayIconSys *this,QResizeEvent *event)

{
  long lVar1;
  bool bVar2;
  QResizeEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QSystemTrayIconSys *in_stack_ffffffffffffffe0;
  QRect *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::update(in_RDI);
  QWidget::resizeEvent(in_RDI,in_RSI);
  bVar2 = QBalloonTip::isBalloonVisible();
  if (bVar2) {
    globalGeometry(in_stack_ffffffffffffffe0);
    QRect::center(in_stack_fffffffffffffff0);
    QBalloonTip::updateBalloonPosition((QPoint *)0xa9a9f3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSystemTrayIconSys::resizeEvent(QResizeEvent *event)
{
    update();
    QWidget::resizeEvent(event);
    if (QBalloonTip::isBalloonVisible())
        QBalloonTip::updateBalloonPosition(globalGeometry().center());
}